

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O1

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint32_t *l)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  bool bVar40;
  uint uVar16;
  uint uVar32;
  
  uVar6 = l[8];
  uVar2 = (ulong)uVar6;
  uVar33 = l[9];
  uVar8 = (ulong)uVar33;
  uVar22 = (uint)(uVar2 * 0x2fc9bebf);
  uVar3 = (int)(uVar2 * 0x2fc9bebf >> 0x20) + l[1] + (uint)CARRY4(uVar22,*l);
  uVar1 = (uint)(uVar8 * 0x2fc9bebf);
  uVar18 = uVar1 + uVar3;
  uVar5 = l[10];
  uVar10 = (ulong)uVar5;
  uVar19 = (uint)(uVar2 * 0x402da173);
  uVar29 = uVar19 + uVar18;
  uVar1 = (int)(uVar2 * 0x402da173 >> 0x20) + (int)(uVar8 * 0x2fc9bebf >> 0x20) + l[2] +
          (uint)(uVar3 < l[1]) + (uint)CARRY4(uVar1,uVar3) + (uint)CARRY4(uVar19,uVar18);
  uVar3 = l[0xb];
  uVar21 = (ulong)uVar3;
  uVar20 = (uint)(uVar10 * 0x2fc9bebf);
  uVar19 = uVar20 + uVar1;
  uVar25 = (uint)(uVar8 * 0x402da173);
  uVar24 = uVar25 + uVar19;
  uVar18 = (uint)(uVar2 * 0x50b75fc4);
  uVar4 = uVar18 + uVar24;
  uVar19 = (uint)CARRY4(uVar25,uVar19) +
           (int)(uVar10 * 0x2fc9bebf >> 0x20) + l[3] +
           (int)(uVar2 * 0x50b75fc4 >> 0x20) + (int)(uVar8 * 0x402da173 >> 0x20) +
           (uint)(uVar1 < l[2]) + (uint)CARRY4(uVar20,uVar1) + (uint)CARRY4(uVar18,uVar24);
  uVar12 = (uint)(uVar21 * 0x2fc9bebf);
  uVar25 = uVar12 + uVar19;
  uVar24 = (uint)(uVar10 * 0x402da173);
  uVar20 = uVar24 + uVar25;
  uVar1 = (uint)(uVar8 * 0x50b75fc4);
  uVar18 = uVar1 + uVar20;
  uVar25 = (uint)CARRY4(uVar24,uVar25) +
           (int)(uVar8 * 0x50b75fc4 >> 0x20) + (int)(uVar10 * 0x402da173 >> 0x20) +
           (int)(uVar21 * 0x2fc9bebf >> 0x20) + (uint)(uVar19 < l[3]) + (uint)CARRY4(uVar12,uVar19)
           + (uint)CARRY4(uVar1,uVar20);
  uVar1 = l[0xc];
  uVar9 = (ulong)uVar1;
  uVar19 = (uint)(uVar2 * 0x45512319);
  uVar35 = uVar19 + uVar18;
  uVar18 = (uint)CARRY4(uVar19,uVar18);
  uVar14 = (uint)(uVar2 * 0x45512319 >> 0x20);
  uVar19 = uVar25 + uVar14;
  uVar12 = uVar19 + uVar18;
  uVar13 = uVar12 + l[4];
  uVar24 = (uint)(uVar9 * 0x2fc9bebf);
  uVar20 = uVar24 + uVar13;
  uVar30 = (uint)(uVar21 * 0x402da173);
  uVar28 = uVar30 + uVar20;
  uVar26 = (uint)(uVar10 * 0x50b75fc4);
  uVar12 = (uint)CARRY4(uVar30,uVar20) +
           (uint)CARRY4(uVar12,l[4]) +
           (int)(uVar9 * 0x2fc9bebf >> 0x20) +
           (int)(uVar10 * 0x50b75fc4 >> 0x20) + (int)(uVar21 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar25,uVar14) || CARRY4(uVar19,uVar18)) + (uint)CARRY4(uVar24,uVar13) +
           (uint)CARRY4(uVar26,uVar28);
  lVar34 = uVar8 * 0x45512319 + (ulong)(uVar26 + uVar28);
  uVar19 = (uint)lVar34;
  uVar13 = (uint)((ulong)lVar34 >> 0x20);
  uVar18 = l[0xd];
  uVar17 = (ulong)uVar18;
  uVar36 = uVar19 + uVar6;
  uVar6 = (uint)CARRY4(uVar19,uVar6);
  uVar19 = uVar13 + uVar12;
  uVar14 = uVar19 + uVar6;
  uVar28 = uVar14 + l[5];
  uVar25 = (uint)(uVar17 * 0x2fc9bebf);
  uVar24 = uVar25 + uVar28;
  uVar26 = (uint)(uVar9 * 0x402da173);
  uVar30 = uVar26 + uVar24;
  uVar20 = (uint)(uVar21 * 0x50b75fc4);
  uVar26 = (uint)CARRY4(uVar26,uVar24) +
           (uint)CARRY4(uVar14,l[5]) +
           (int)(uVar17 * 0x2fc9bebf >> 0x20) +
           (int)(uVar21 * 0x50b75fc4 >> 0x20) + (int)(uVar9 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar13,uVar12) || CARRY4(uVar19,uVar6)) + (uint)CARRY4(uVar25,uVar28) +
           (uint)CARRY4(uVar20,uVar30);
  lVar34 = uVar10 * 0x45512319 + (ulong)(uVar20 + uVar30);
  uVar19 = (uint)lVar34;
  uVar14 = (uint)((ulong)lVar34 >> 0x20);
  uVar6 = l[0xe];
  uVar2 = (ulong)uVar6;
  uVar37 = uVar19 + uVar33;
  uVar33 = (uint)CARRY4(uVar19,uVar33);
  uVar19 = uVar14 + uVar26;
  uVar28 = uVar19 + uVar33;
  uVar30 = uVar28 + l[6];
  uVar20 = (uint)(uVar2 * 0x2fc9bebf);
  uVar24 = uVar20 + uVar30;
  uVar12 = (uint)(uVar17 * 0x402da173);
  uVar25 = uVar12 + uVar24;
  uVar13 = (uint)(uVar9 * 0x50b75fc4);
  uVar26 = (uint)CARRY4(uVar12,uVar24) +
           (uint)CARRY4(uVar28,l[6]) +
           (int)(uVar2 * 0x2fc9bebf >> 0x20) +
           (int)(uVar9 * 0x50b75fc4 >> 0x20) + (int)(uVar17 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar14,uVar26) || CARRY4(uVar19,uVar33)) + (uint)CARRY4(uVar20,uVar30) +
           (uint)CARRY4(uVar13,uVar25);
  lVar34 = uVar21 * 0x45512319 + (ulong)(uVar13 + uVar25);
  uVar19 = (uint)lVar34;
  uVar14 = (uint)((ulong)lVar34 >> 0x20);
  uVar33 = l[0xf];
  uVar8 = (ulong)uVar33;
  uVar38 = uVar19 + uVar5;
  uVar5 = (uint)CARRY4(uVar19,uVar5);
  uVar19 = uVar14 + uVar26;
  uVar28 = uVar19 + uVar5;
  uVar30 = uVar28 + l[7];
  uVar24 = (uint)(uVar8 * 0x2fc9bebf);
  uVar20 = uVar24 + uVar30;
  uVar25 = (uint)(uVar2 * 0x402da173);
  uVar12 = uVar25 + uVar20;
  uVar13 = (uint)(uVar17 * 0x50b75fc4);
  uVar27 = (uint)CARRY4(uVar25,uVar20) +
           (uint)CARRY4(uVar28,l[7]) +
           (int)(uVar8 * 0x2fc9bebf >> 0x20) +
           (int)(uVar17 * 0x50b75fc4 >> 0x20) + (int)(uVar2 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar14,uVar26) || CARRY4(uVar19,uVar5)) + (uint)CARRY4(uVar24,uVar30) +
           (uint)CARRY4(uVar13,uVar12);
  lVar34 = uVar9 * 0x45512319 + (ulong)(uVar13 + uVar12);
  uVar5 = (uint)lVar34;
  uVar14 = (uint)((ulong)lVar34 >> 0x20);
  uVar13 = (uint)(uVar8 * 0x50b75fc4);
  uVar12 = uVar5 + uVar3;
  uVar5 = (uint)CARRY4(uVar5,uVar3);
  uVar3 = uVar14 + uVar27;
  uVar28 = uVar3 + uVar5;
  uVar19 = (uint)(uVar8 * 0x402da173);
  uVar30 = uVar28 + uVar19;
  uVar39 = (uint)(uVar2 * 0x50b75fc4);
  uVar26 = uVar39 + uVar30;
  uVar20 = (uint)(uVar17 * 0x45512319);
  uVar24 = uVar20 + uVar26;
  uVar25 = uVar24 + uVar1;
  uVar9 = (ulong)uVar25;
  uVar5 = (uint)CARRY4(uVar20,uVar26) +
          (uint)CARRY4(uVar28,uVar19) +
          (int)(uVar8 * 0x402da173 >> 0x20) +
          (int)(uVar17 * 0x45512319 >> 0x20) + (int)(uVar2 * 0x50b75fc4 >> 0x20) + uVar13 +
          (uint)(CARRY4(uVar14,uVar27) || CARRY4(uVar3,uVar5)) + (uint)CARRY4(uVar39,uVar30) +
          (uint)CARRY4(uVar24,uVar1);
  uVar1 = (uint)(uVar2 * 0x45512319);
  uVar3 = uVar1 + uVar5;
  uVar19 = (uint)(uVar8 * 0x45512319);
  uVar14 = uVar3 + uVar18;
  uVar10 = (ulong)uVar14;
  uVar5 = (int)(uVar2 * 0x45512319 >> 0x20) + uVar19 + (int)(uVar8 * 0x50b75fc4 >> 0x20) +
          (uint)(uVar5 < uVar13) + (uint)CARRY4(uVar1,uVar5) + (uint)CARRY4(uVar3,uVar18);
  uVar26 = uVar5 + uVar6;
  uVar17 = (ulong)uVar26;
  uVar39 = (int)(uVar8 * 0x145512319 >> 0x20) + (uint)(uVar5 < uVar19) + (uint)CARRY4(uVar5,uVar6);
  uVar8 = (ulong)uVar39;
  uVar2 = uVar9 * 0x2fc9bebf + CONCAT44(uVar29,uVar22 + *l);
  uVar6 = (uint)(uVar2 >> 0x20);
  uVar5 = (uint)(uVar10 * 0x2fc9bebf);
  uVar18 = uVar5 + uVar6;
  uVar28 = (uint)(uVar9 * 0x402da173);
  uVar6 = (int)(uVar9 * 0x402da173 >> 0x20) + uVar4 + (uint)(uVar6 < uVar29) +
          (int)(uVar10 * 0x2fc9bebf >> 0x20) + (uint)CARRY4(uVar5,uVar6) +
          (uint)CARRY4(uVar28,uVar18);
  uVar3 = (uint)(uVar17 * 0x2fc9bebf);
  uVar5 = uVar3 + uVar6;
  uVar1 = (uint)(uVar10 * 0x402da173);
  uVar30 = uVar1 + uVar5;
  uVar24 = (uint)(uVar9 * 0x50b75fc4);
  uVar5 = (uint)CARRY4(uVar1,uVar5) +
          (int)(uVar10 * 0x402da173 >> 0x20) + (int)(uVar9 * 0x50b75fc4 >> 0x20) + uVar35 +
          (int)(uVar17 * 0x2fc9bebf >> 0x20) + (uint)(uVar6 < uVar4) + (uint)CARRY4(uVar3,uVar6) +
          (uint)CARRY4(uVar24,uVar30);
  uVar20 = (uint)(uVar8 * 0x2fc9bebf);
  uVar22 = uVar20 + uVar5;
  uVar19 = (uint)(uVar17 * 0x402da173);
  uVar3 = uVar19 + uVar22;
  uVar6 = (uint)(uVar10 * 0x50b75fc4);
  uVar1 = uVar6 + uVar3;
  uVar19 = (uint)CARRY4(uVar19,uVar22) +
           (int)(uVar10 * 0x50b75fc4 >> 0x20) + (int)(uVar17 * 0x402da173 >> 0x20) +
           (int)(uVar8 * 0x2fc9bebf >> 0x20) + (uint)(uVar5 < uVar35) + (uint)CARRY4(uVar20,uVar5) +
           (uint)CARRY4(uVar6,uVar3);
  uVar4 = (uint)(uVar9 * 0x45512319);
  uVar6 = (uint)CARRY4(uVar4,uVar1);
  uVar13 = (uint)(uVar9 * 0x45512319 >> 0x20);
  uVar5 = uVar19 + uVar13;
  uVar22 = uVar5 + uVar6;
  uVar20 = uVar22 + uVar36;
  bVar40 = uVar33 <= uVar39;
  uVar3 = 0x2fc9bebf;
  if (bVar40) {
    uVar3 = 0;
  }
  uVar27 = 0x402da173;
  if (bVar40) {
    uVar27 = 0;
  }
  uVar29 = 0x50b75fc4;
  if (bVar40) {
    uVar29 = 0;
  }
  uVar11 = uVar3 + uVar20;
  uVar32 = (uint)(uVar8 * 0x402da173);
  uVar31 = uVar32 + uVar11;
  uVar16 = (uint)(uVar17 * 0x50b75fc4);
  uVar15 = uVar16 + uVar31;
  uVar35 = (uint)(uVar10 * 0x45512319);
  uVar7 = uVar35 + uVar15;
  uVar3 = (uint)CARRY4(uVar35,uVar15) +
          (uint)CARRY4(uVar32,uVar11) +
          (uint)CARRY4(uVar22,uVar36) +
          (int)(uVar8 * 0x402da173 >> 0x20) +
          (int)(uVar17 * 0x50b75fc4 >> 0x20) + (int)(uVar10 * 0x45512319 >> 0x20) + uVar37 +
          (uint)(CARRY4(uVar19,uVar13) || CARRY4(uVar5,uVar6)) + (uint)CARRY4(uVar3,uVar20) +
          (uint)CARRY4(uVar16,uVar31) + (uint)CARRY4(uVar7,uVar25);
  uVar22 = (uint)(uVar8 * 0x50b75fc4);
  uVar19 = uVar22 + uVar27 + uVar3;
  uVar5 = (uint)(uVar17 * 0x45512319);
  uVar6 = uVar5 + uVar19;
  uVar19 = (uint)CARRY4(uVar5,uVar19) +
           uVar38 + (int)(uVar17 * 0x45512319 >> 0x20) + (int)(uVar8 * 0x50b75fc4 >> 0x20) +
           (uint)(uVar3 < uVar37) + (uint)CARRY4(uVar27,uVar3) + (uint)CARRY4(uVar22,uVar27 + uVar3)
           + (uint)CARRY4(uVar6,uVar14);
  uVar5 = (uint)(uVar8 * 0x45512319);
  uVar3 = uVar5 + uVar19 + uVar29;
  uVar19 = (uint)CARRY4(uVar5,uVar19 + uVar29) +
           uVar12 + (int)(uVar8 * 0x45512319 >> 0x20) + (uint)(uVar19 < uVar38) +
           (uint)CARRY4(uVar19,uVar29) + (uint)CARRY4(uVar3,uVar26);
  uVar5 = 0x45512319;
  if (uVar39 >= uVar33) {
    uVar5 = 0;
  }
  lVar34 = (ulong)CARRY4(uVar5,uVar19) + (ulong)(uVar19 < uVar12) + (ulong)(uVar39 < uVar33) +
           (ulong)CARRY4(uVar5 + uVar19,uVar39);
  uVar21 = lVar34 * 0x2fc9bebf + (uVar2 & 0xffffffff);
  uVar23 = lVar34 * 0x402da173 + (ulong)(uVar28 + uVar18) + (uVar21 >> 0x20);
  uVar10 = lVar34 * 0x50b75fc4 + (ulong)(uVar24 + uVar30) + (uVar23 >> 0x20);
  uVar2 = lVar34 * 0x45512319 + (ulong)(uVar4 + uVar1) + (uVar10 >> 0x20);
  uVar8 = (ulong)(uVar7 + uVar25) + lVar34 + (uVar2 >> 0x20);
  uVar9 = (ulong)(uVar6 + uVar14) + (uVar8 >> 0x20);
  uVar17 = (ulong)(uVar3 + uVar26) + (uVar9 >> 0x20);
  lVar34 = (ulong)(uVar5 + uVar19 + uVar39) + (uVar17 >> 0x20);
  uVar5 = (uint)lVar34;
  uVar6 = (uint)((uint)uVar8 < 0xfffffffe || ((uint)uVar17 & (uint)uVar9 & uVar5) != 0xffffffff);
  uVar33 = uVar6 ^ 1;
  if ((uint)uVar8 != 0xffffffff) {
    uVar33 = 0;
  }
  uVar3 = uVar33 ^ 1;
  if (0xbaaedce5 < (uint)uVar2) {
    uVar3 = 0;
  }
  uVar3 = uVar3 | uVar6;
  uVar33 = (uint)(0xbaaedce6 < (uint)uVar2) & ~uVar3 | uVar33;
  uVar6 = uVar33 ^ 1;
  if (0xaf48a03a < (uint)uVar10) {
    uVar6 = 0;
  }
  uVar6 = uVar6 | uVar3;
  uVar33 = (uint)(0xaf48a03b < (uint)uVar10) & ~uVar6 | uVar33;
  uVar3 = ~uVar33;
  if (0xbfd25e8b < (uint)uVar23) {
    uVar3 = 0xbfd25e8c;
  }
  uVar1 = ~(uVar3 | uVar6);
  uVar3 = (uint)uVar21;
  uVar6 = 0xd0364140 < uVar3 & uVar1;
  if (0xbfd25e8c < (uint)uVar23) {
    uVar6 = uVar1 & 1;
  }
  uVar6 = (int)((ulong)lVar34 >> 0x20) + (uVar6 | uVar33);
  r->d[0] = uVar6 * 0x2fc9bebf + uVar3;
  uVar21 = (ulong)(uVar6 * 0x402da173) + (uVar23 & 0xffffffff) +
           (ulong)CARRY4(uVar6 * 0x2fc9bebf,uVar3);
  r->d[1] = (uint32_t)uVar21;
  uVar10 = (ulong)(uVar6 * 0x50b75fc4) + (uVar10 & 0xffffffff) + (uVar21 >> 0x20);
  r->d[2] = (uint32_t)uVar10;
  uVar2 = (ulong)(uVar6 * 0x45512319) + (uVar2 & 0xffffffff) + (uVar10 >> 0x20);
  r->d[3] = (uint32_t)uVar2;
  uVar2 = (ulong)uVar6 + (uVar8 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[4] = (uint32_t)uVar2;
  uVar2 = (uVar9 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[5] = (uint32_t)uVar2;
  lVar34 = (uVar17 & 0xffffffff) + (uVar2 >> 0x20);
  r->d[6] = (uint32_t)lVar34;
  r->d[7] = (int)((ulong)lVar34 >> 0x20) + uVar5;
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint32_t *l) {
    uint64_t c;
    uint32_t n0 = l[8], n1 = l[9], n2 = l[10], n3 = l[11], n4 = l[12], n5 = l[13], n6 = l[14], n7 = l[15];
    uint32_t m0, m1, m2, m3, m4, m5, m6, m7, m8, m9, m10, m11, m12;
    uint32_t p0, p1, p2, p3, p4, p5, p6, p7, p8;

    /* 96 bit accumulator. */
    uint32_t c0, c1, c2;

    /* Reduce 512 bits into 385. */
    /* m[0..12] = l[0..7] + n[0..7] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    muladd(n0, SECP256K1_N_C_2);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    muladd(n1, SECP256K1_N_C_2);
    muladd(n0, SECP256K1_N_C_3);
    extract(m3);
    sumadd(l[4]);
    muladd(n4, SECP256K1_N_C_0);
    muladd(n3, SECP256K1_N_C_1);
    muladd(n2, SECP256K1_N_C_2);
    muladd(n1, SECP256K1_N_C_3);
    sumadd(n0);
    extract(m4);
    sumadd(l[5]);
    muladd(n5, SECP256K1_N_C_0);
    muladd(n4, SECP256K1_N_C_1);
    muladd(n3, SECP256K1_N_C_2);
    muladd(n2, SECP256K1_N_C_3);
    sumadd(n1);
    extract(m5);
    sumadd(l[6]);
    muladd(n6, SECP256K1_N_C_0);
    muladd(n5, SECP256K1_N_C_1);
    muladd(n4, SECP256K1_N_C_2);
    muladd(n3, SECP256K1_N_C_3);
    sumadd(n2);
    extract(m6);
    sumadd(l[7]);
    muladd(n7, SECP256K1_N_C_0);
    muladd(n6, SECP256K1_N_C_1);
    muladd(n5, SECP256K1_N_C_2);
    muladd(n4, SECP256K1_N_C_3);
    sumadd(n3);
    extract(m7);
    muladd(n7, SECP256K1_N_C_1);
    muladd(n6, SECP256K1_N_C_2);
    muladd(n5, SECP256K1_N_C_3);
    sumadd(n4);
    extract(m8);
    muladd(n7, SECP256K1_N_C_2);
    muladd(n6, SECP256K1_N_C_3);
    sumadd(n5);
    extract(m9);
    muladd(n7, SECP256K1_N_C_3);
    sumadd(n6);
    extract(m10);
    sumadd_fast(n7);
    extract_fast(m11);
    VERIFY_CHECK(c0 <= 1);
    m12 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..8] = m[0..7] + m[8..12] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m8, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m9, SECP256K1_N_C_0);
    muladd(m8, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m10, SECP256K1_N_C_0);
    muladd(m9, SECP256K1_N_C_1);
    muladd(m8, SECP256K1_N_C_2);
    extract(p2);
    sumadd(m3);
    muladd(m11, SECP256K1_N_C_0);
    muladd(m10, SECP256K1_N_C_1);
    muladd(m9, SECP256K1_N_C_2);
    muladd(m8, SECP256K1_N_C_3);
    extract(p3);
    sumadd(m4);
    muladd(m12, SECP256K1_N_C_0);
    muladd(m11, SECP256K1_N_C_1);
    muladd(m10, SECP256K1_N_C_2);
    muladd(m9, SECP256K1_N_C_3);
    sumadd(m8);
    extract(p4);
    sumadd(m5);
    muladd(m12, SECP256K1_N_C_1);
    muladd(m11, SECP256K1_N_C_2);
    muladd(m10, SECP256K1_N_C_3);
    sumadd(m9);
    extract(p5);
    sumadd(m6);
    muladd(m12, SECP256K1_N_C_2);
    muladd(m11, SECP256K1_N_C_3);
    sumadd(m10);
    extract(p6);
    sumadd_fast(m7);
    muladd_fast(m12, SECP256K1_N_C_3);
    sumadd_fast(m11);
    extract_fast(p7);
    p8 = c0 + m12;
    VERIFY_CHECK(p8 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..7] = p[0..7] + p[8] * SECP256K1_N_C. */
    c = p0 + (uint64_t)SECP256K1_N_C_0 * p8;
    r->d[0] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p1 + (uint64_t)SECP256K1_N_C_1 * p8;
    r->d[1] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p2 + (uint64_t)SECP256K1_N_C_2 * p8;
    r->d[2] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p3 + (uint64_t)SECP256K1_N_C_3 * p8;
    r->d[3] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p4 + (uint64_t)p8;
    r->d[4] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p5;
    r->d[5] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p6;
    r->d[6] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p7;
    r->d[7] = c & 0xFFFFFFFFUL; c >>= 32;

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}